

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O1

void __thiscall
CVmImageWriter::begin_pool_page
          (CVmImageWriter *this,uint pool_id,uint32_t page_index,int mandatory,uchar xor_mask)

{
  uint32_t tmp_1;
  uint16_t tmp;
  char buf [16];
  undefined2 local_38;
  uint32_t local_36;
  uchar local_32;
  
  begin_block(this,"CPPG",mandatory);
  local_38 = (undefined2)pool_id;
  local_36 = page_index;
  local_32 = xor_mask;
  CVmFile::write_bytes(this->fp_,(char *)&local_38,7);
  return;
}

Assistant:

void CVmImageWriter::begin_pool_page(uint pool_id, uint32_t page_index,
                                     int mandatory, uchar xor_mask)
{
    char buf[16];

    /* begin the block */
    begin_block("CPPG", mandatory);

    /* prepare the prefix */
    oswp2(buf, pool_id);
    oswp4(buf+2, page_index);
    buf[6] = xor_mask;

    /* write the prefix */
    fp_->write_bytes(buf, 7);
}